

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O2

int write_directory_descriptors(archive_write *a,vdd *vdd)

{
  iso9660_conflict *iso9660_00;
  size_t sVar1;
  isoent **ppiVar2;
  content_conflict *pcVar3;
  extr_rec *peVar4;
  void *pvVar5;
  int iVar6;
  isoent *piVar7;
  long lVar8;
  isofile *piVar9;
  anon_struct_24_3_5afa785c_for_extr_rec_list *paVar10;
  iso9660_conflict *iso9660;
  int iVar11;
  uchar *puVar12;
  isoent *isoent;
  uchar *p;
  
  iVar11 = 0;
  isoent = vdd->rootent;
  do {
    iso9660_00 = (iso9660_conflict *)a->format_data;
    sVar1 = iso9660_00->wbuff_remaining;
    p = (uchar *)((long)iso9660_00 + (0x102dc - sVar1));
    iVar6 = set_directory_record(p,0x800,isoent,iso9660_00,DIR_REC_SELF,vdd->vdd_type);
    puVar12 = (uchar *)((long)iso9660_00 + ((long)iVar6 - sVar1) + 0x102dc);
    iVar6 = set_directory_record
                      (puVar12,0x800 - (long)iVar6,isoent,iso9660_00,DIR_REC_PARENT,vdd->vdd_type);
    puVar12 = puVar12 + iVar6;
    iVar6 = (isoent->children).cnt;
    if ((0 < iVar6) &&
       (((vdd->vdd_type == VDD_JOLIET || ((*(ushort *)&(iso9660_00->opt).field_0x2 & 0x180) != 0))
        || (iVar11 + 1 < vdd->max_depth)))) {
      ppiVar2 = isoent->children_sorted;
      for (lVar8 = 0; lVar8 < iVar6; lVar8 = lVar8 + 1) {
        piVar7 = ppiVar2[lVar8];
        piVar9 = piVar7->file->hardlink_target;
        if (piVar9 == (isofile *)0x0) {
          piVar9 = piVar7->file;
        }
        piVar9->cur_content = &piVar9->content;
        do {
          iVar6 = set_directory_record
                            (puVar12,(size_t)(p + (0x800 - (long)puVar12)),piVar7,iso9660_00,
                             DIR_REC_NORMAL,vdd->vdd_type);
          if (iVar6 == 0) {
            memset(puVar12,0,(size_t)(p + (0x800 - (long)puVar12)));
            iVar6 = wb_consume(a,0x800);
            if (iVar6 < 0) {
              return iVar6;
            }
            p = (uchar *)((long)a->format_data +
                         (0x102dc - *(long *)((long)a->format_data + 0x102e0)));
            iVar6 = set_directory_record(p,0x800,piVar7,iso9660_00,DIR_REC_NORMAL,vdd->vdd_type);
            puVar12 = p;
          }
          puVar12 = puVar12 + iVar6;
          pcVar3 = piVar9->cur_content->next;
          piVar9->cur_content = pcVar3;
        } while (pcVar3 != (content_conflict *)0x0);
        iVar6 = (isoent->children).cnt;
      }
    }
    memset(puVar12,0,(size_t)(p + (0x800 - (long)puVar12)));
    iVar6 = wb_consume(a,0x800);
    if (iVar6 < 0) {
      return iVar6;
    }
    if (vdd->vdd_type != VDD_JOLIET) {
      paVar10 = &isoent->extr_rec_list;
      while (peVar4 = paVar10->first, peVar4 != (extr_rec *)0x0) {
        pvVar5 = a->format_data;
        lVar8 = *(long *)((long)pvVar5 + 0x102e0);
        memcpy((void *)((long)pvVar5 + (0x102dc - lVar8)),peVar4->buf,(long)peVar4->offset);
        memset((void *)((long)pvVar5 + (peVar4->offset - lVar8) + 0x102dc),0,
               0x800 - (long)peVar4->offset);
        iVar6 = wb_consume(a,0x800);
        paVar10 = (anon_struct_24_3_5afa785c_for_extr_rec_list *)&peVar4->next;
        if (iVar6 < 0) {
          return iVar6;
        }
      }
    }
    piVar7 = (isoent->subdirs).first;
    if ((piVar7 == (isoent *)0x0) || (iVar6 = iVar11 + 1, vdd->max_depth <= iVar11 + 1)) {
      while ((piVar7 = isoent, ppiVar2 = &piVar7->parent, iVar6 = iVar11, piVar7 != *ppiVar2 &&
             (piVar7 = piVar7->drnext, piVar7 == (isoent *)0x0))) {
        iVar11 = iVar11 + -1;
        isoent = *ppiVar2;
      }
    }
    iVar11 = iVar6;
    isoent = piVar7;
  } while (piVar7 != piVar7->parent);
  return 0;
}

Assistant:

static int
write_directory_descriptors(struct archive_write *a, struct vdd *vdd)
{
	struct isoent *np;
	int depth, r;

	depth = 0;
	np = vdd->rootent;
	do {
		struct extr_rec *extr;

		r = _write_directory_descriptors(a, vdd, np, depth);
		if (r < 0)
			return (r);
		if (vdd->vdd_type != VDD_JOLIET) {
			/*
			 * This extract record is used by SUSP,RRIP.
			 * Not for joliet.
			 */
			for (extr = np->extr_rec_list.first;
			    extr != NULL;
			    extr = extr->next) {
				unsigned char *wb;

				wb = wb_buffptr(a);
				memcpy(wb, extr->buf, extr->offset);
				memset(wb + extr->offset, 0,
				    LOGICAL_BLOCK_SIZE - extr->offset);
				r = wb_consume(a, LOGICAL_BLOCK_SIZE);
				if (r < 0)
					return (r);
			}
		}

		if (np->subdirs.first != NULL && depth + 1 < vdd->max_depth) {
			/* Enter to sub directories. */
			np = np->subdirs.first;
			depth++;
			continue;
		}
		while (np != np->parent) {
			if (np->drnext == NULL) {
				/* Return to the parent directory. */
				np = np->parent;
				depth--;
			} else {
				np = np->drnext;
				break;
			}
		}
	} while (np != np->parent);

	return (ARCHIVE_OK);
}